

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O1

void __thiscall
Refal2::CUnitList::HandyPrint(CUnitList *this,ostream *outputStream,CPrintHelper *printHelper)

{
  TUnitType TVar1;
  bool bVar2;
  bool bVar3;
  undefined8 in_RAX;
  ostream *poVar4;
  char *pcVar5;
  CNodeType *pCVar6;
  undefined8 uStack_38;
  
  pCVar6 = (this->super_CNodeList<Refal2::CUnit>).first;
  if (pCVar6 != (CNodeType *)0x0) {
    bVar2 = false;
    uStack_38 = in_RAX;
    do {
      if ((pCVar6->super_CUnit).type == UT_Char) {
        bVar3 = true;
        if (!bVar2) {
LAB_001328f3:
          bVar2 = bVar3;
          std::__ostream_insert<char,std::char_traits<char>>(outputStream,"\'",1);
        }
      }
      else if (bVar2) {
        bVar3 = false;
        goto LAB_001328f3;
      }
      TVar1 = (pCVar6->super_CUnit).type;
      poVar4 = outputStream;
      if ((int)TVar1 < 0x10) {
        if (TVar1 == UT_Char) {
          uStack_38 = CONCAT17((pCVar6->super_CUnit).field_1.c,(undefined7)uStack_38);
          pcVar5 = (char *)((long)&uStack_38 + 7);
        }
        else {
          if (TVar1 == UT_Label) {
            std::__ostream_insert<char,std::char_traits<char>>(outputStream,"/",1);
            (*printHelper->_vptr_CPrintHelper[1])
                      (printHelper,outputStream,(ulong)(pCVar6->super_CUnit).field_1.number);
          }
          else {
            if (TVar1 != UT_Number) goto LAB_00132a3a;
            std::__ostream_insert<char,std::char_traits<char>>(outputStream,"/",1);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)outputStream);
          }
          pcVar5 = "/";
        }
      }
      else if ((int)TVar1 < 0x40) {
        if (TVar1 == UT_LeftParen) {
          pcVar5 = "(";
        }
        else {
          if (TVar1 != UT_RightParen) {
LAB_00132a3a:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                          ,0xa1,
                          "void Refal2::CUnitList::HandyPrint(std::ostream &, const CPrintHelper &) const"
                         );
          }
          pcVar5 = ")";
        }
      }
      else if (TVar1 == UT_LeftBracket) {
        pcVar5 = "<";
      }
      else {
        if (TVar1 != UT_RightBracket) goto LAB_00132a3a;
        pcVar5 = ">";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,1);
      pCVar6 = pCVar6->next;
    } while (pCVar6 != (CNode<Refal2::CUnit> *)0x0);
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>(outputStream,"\'",1);
    }
  }
  return;
}

Assistant:

void CUnitList::HandyPrint( std::ostream& outputStream,
	const CPrintHelper& printHelper ) const
{
	bool lastWasChar = false;
	for( const CUnitNode* node = GetFirst(); node != 0; node = node->Next() ) {
		if( node->GetType() == UT_Char ) {
			if( !lastWasChar ) {
				outputStream << "'";
				lastWasChar = true;
			}
		} else {
			if( lastWasChar ) {
				outputStream << "'";
				lastWasChar = false;
			}
		}
		switch( node->GetType() ) {
			case UT_Char:
				outputStream << node->Char();
				break;
			case UT_Label:
				outputStream << "/";
				printHelper.Label( outputStream, node->Label() );
				outputStream << "/";
				break;
			case UT_Number:
				outputStream << "/" << node->Number() << "/";
				break;
			case UT_LeftParen:
				outputStream << "(";
				break;
			case UT_RightParen:
				outputStream << ")";
				break;
			case UT_LeftBracket:
				outputStream << "<";
				break;
			case UT_RightBracket:
				outputStream << ">";
				break;
			case UT_Variable:
			default:
				assert( false );
				break;
		}
	}
	if( lastWasChar ) {
		outputStream << "'";
	}
}